

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_demotion.c
# Opt level: O2

value value_type_demotion_boolean(value v,type_id id)

{
  char *pcVar1;
  type_id id_00;
  int iVar2;
  size_t iterator;
  size_t sVar3;
  value v_00;
  long lVar4;
  bool bVar5;
  bool bVar6;
  anon_union_8_3_4e909c24 buffer;
  
  buffer.d = 0.0;
  id_00 = value_type_id(v);
  iVar2 = type_id_integer(id_00);
  if (((iVar2 == 0) || (iVar2 = type_id_decimal(id_00), iVar2 == 0)) &&
     (iVar2 = type_id_boolean(id), iVar2 == 0)) {
    if (id_00 != id) {
      sVar3 = value_type_id_size(id_00);
      value_to(v,&buffer,sVar3);
      sVar3 = value_type_id_size(id);
      v_00 = value_type_create((void *)0x0,sVar3,id);
      if (v_00 != (value)0x0) {
        value_destroy(v);
        iVar2 = type_id_decimal(id_00);
        if (iVar2 == 0) {
          if (id_00 == 6) {
            bVar5 = NAN(buffer.d);
            bVar6 = buffer.d == 0.0;
          }
          else {
            if (id_00 != 5) {
              return v_00;
            }
            bVar5 = NAN(buffer.f);
            bVar6 = buffer.f == 0.0;
          }
          if ((bVar6) && (!bVar5)) {
            return v_00;
          }
        }
        else {
          lVar4 = 0;
          do {
            if (lVar4 == 8) {
              return v_00;
            }
            pcVar1 = buffer.b + lVar4;
            lVar4 = lVar4 + 1;
          } while (*pcVar1 == '\0');
        }
        v = value_from_bool(v_00,'\x01');
      }
    }
  }
  else {
    v = (value)0x0;
  }
  return v;
}

Assistant:

value value_type_demotion_boolean(value v, type_id id)
{
	union
	{
		char b[8];
		float f;
		double d;
	} buffer = {
		{ 0 }
	};

	value demotion = NULL;

	type_id v_id = value_type_id(v);

	if (!(type_id_integer(v_id) == 0 || type_id_decimal(v_id) == 0) || type_id_boolean(id) != 0)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	value_to(v, (void *)&buffer.b[0], value_type_id_size(v_id));

	demotion = value_type_create(NULL, value_type_id_size(id), id);

	if (demotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	if (type_id_decimal(v_id) == 0)
	{
		if (v_id == TYPE_FLOAT)
		{
			if (buffer.f != 0.0f && buffer.f != -0.0f)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else if (v_id == TYPE_DOUBLE)
		{
			if (buffer.d != 0.0 && buffer.d != -0.0)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else
		{
			/* error */
		}
	}
	else
	{
		size_t iterator;

		for (iterator = 0; iterator < 8; ++iterator)
		{
			if (buffer.b[iterator] != 0x00)
			{
				return value_from_bool(demotion, 1L);
			}
		}
	}

	return demotion;
}